

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateRandomBernoulliLikeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  LayerUnion LVar3;
  long *plVar4;
  size_type *psVar5;
  string err;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  undefined1 local_88 [24];
  pointer local_70;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  Result::Result((Result *)&local_70);
  validateInputCount((Result *)local_98,layer,1,1);
  local_70 = (pointer)local_98;
  std::__cxx11::string::operator=((string *)&local_68,(string *)&local_90);
  if (local_90._M_p != local_88 + 8) {
    operator_delete(local_90._M_p,local_88._8_8_ + 1);
  }
  bVar2 = Result::good((Result *)&local_70);
  if (bVar2) {
    validateOutputCount((Result *)local_98,layer,1,1);
    local_70 = (pointer)local_98;
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_90);
    if (local_90._M_p != local_88 + 8) {
      operator_delete(local_90._M_p,local_88._8_8_ + 1);
    }
  }
  if (layer->_oneof_case_[0] == 0x4ba) {
    LVar3 = layer->layer_;
  }
  else {
    LVar3.randombernoullilike_ = Specification::RandomBernoulliLikeLayerParams::default_instance();
  }
  if (((LVar3.unary_)->epsilon_ < 0.0) || (1.0 < (LVar3.unary_)->epsilon_)) {
    std::operator+(&local_48,"Value of prob should be in range [0: 1] for \'",(layer->name_).ptr_);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      local_88._0_8_ = *psVar5;
      local_88._8_8_ = plVar4[3];
      local_98 = (undefined1  [8])local_88;
    }
    else {
      local_88._0_8_ = *psVar5;
      local_98 = (undefined1  [8])*plVar4;
    }
    local_90._M_p = (pointer)plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
    if (local_98 != (undefined1  [8])local_88) {
      operator_delete((void *)local_98,local_88._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p != &local_58) {
      operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
    }
  }
  else {
    *(pointer *)__return_storage_ptr__ = local_70;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p == &local_58) {
      paVar1->_M_allocated_capacity = local_58._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_58._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_68._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           local_58._M_allocated_capacity;
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_60;
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateRandomBernoulliLikeLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    const auto& params = layer.randombernoullilike();
    if (params.prob() < 0.0f || params.prob() > 1.0f) {
        const std::string err = "Value of prob should be in range [0: 1] for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return r;
}